

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::repl::exec(repl *this,string *code)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 uVar8;
  element_type *peVar9;
  ulong uVar10;
  long in_RDI;
  string version_str;
  int code_1;
  string arg;
  size_type pos;
  string line;
  string cmd;
  char *ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  int mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  allocator *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  void *in_stack_fffffffffffffc20;
  event_type *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  char *__lhs;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 uVar12;
  undefined1 in_stack_fffffffffffffc64;
  undefined1 in_stack_fffffffffffffc65;
  string *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  exception *this_00;
  allocator local_359;
  string local_358 [38];
  undefined1 local_332;
  allocator local_331;
  string local_330 [96];
  string local_2d0 [39];
  undefined1 local_2a9;
  string local_1e8 [32];
  string *in_stack_fffffffffffffe38;
  repl *in_stack_fffffffffffffe40;
  allocator local_199;
  string local_198 [128];
  string local_118 [36];
  undefined4 local_f4;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  long local_90;
  string local_88 [48];
  undefined1 local_58 [48];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [2];
  int local_14;
  
  *(long *)(in_RDI + 0x80) = *(long *)(in_RDI + 0x80) + 1;
  local_14 = 0;
  local_28[0]._M_current = (char *)std::__cxx11::string::begin();
  local_58._40_8_ = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffc10,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffc08), bVar1) {
    local_58._32_8_ =
         __gnu_cxx::
         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(local_28);
    if (local_14 == 0) {
      iVar7 = isspace((int)*(char *)local_58._32_8_);
      if (iVar7 == 0) {
        if (*(char *)local_58._32_8_ == '#') {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4efe9b);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffc10);
          return;
        }
        if (*(char *)local_58._32_8_ == '@') {
          local_14 = 1;
        }
        else {
          local_14 = -1;
        }
      }
    }
    else {
      if (local_14 != 1) break;
      iVar7 = isspace((int)*(char *)local_58._32_8_);
      if (iVar7 == 0) {
        std::__cxx11::string::push_back((char)in_RDI + -0x50);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_28);
  }
  if (local_14 != 0) {
    if (local_14 == 1) {
      this_00 = (exception *)local_58;
      std::__cxx11::string::string((string *)this_00);
      std::swap<char,std::char_traits<char>,std::allocator<char>>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      bVar1 = std::operator==(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
      if ((bVar1) && ((*(byte *)(in_RDI + 0x88) & 1) == 0)) {
        *(undefined1 *)(in_RDI + 0x88) = 1;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4effca);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffc10);
      }
      else {
        uVar2 = std::operator==(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
        if (((bool)uVar2) && ((*(byte *)(in_RDI + 0x88) & 1) != 0)) {
          *(undefined1 *)(in_RDI + 0x88) = 0;
          std::__cxx11::string::string(local_88);
          std::swap<char,std::char_traits<char>,std::allocator<char>>
                    (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          run(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          std::__cxx11::string::~string(local_88);
        }
        else {
          local_90 = std::__cxx11::string::find((char)local_58,0x3a);
          std::__cxx11::string::string(local_b0);
          if (local_90 != -1) {
            std::__cxx11::string::substr((ulong)local_d0,(ulong)local_58);
            in_stack_fffffffffffffc68 = local_d0;
            std::__cxx11::string::operator=(local_b0,in_stack_fffffffffffffc68);
            std::__cxx11::string::~string(in_stack_fffffffffffffc68);
            std::__cxx11::string::substr((ulong)local_f0,(ulong)local_58);
            std::__cxx11::string::operator=((string *)local_58,local_f0);
            std::__cxx11::string::~string(local_f0);
          }
          uVar3 = std::operator==(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
          if ((bool)uVar3) {
            local_f4 = 0;
            event_type::touch(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          }
          else {
            uVar4 = std::operator==(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
            if ((bool)uVar4) {
              uVar6 = std::operator==(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
              if ((bool)uVar6) {
                *(undefined4 *)(in_RDI + 0x78) = 0;
              }
              else {
                uVar5 = std::operator==(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08)
                ;
                if ((bool)uVar5) {
                  *(undefined4 *)(in_RDI + 0x78) = 1;
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffc10,
                                          (char *)in_stack_fffffffffffffc08);
                  uVar12 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc60);
                  if (!bVar1) {
                    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __cxa_allocate_exception(0x90);
                    __lhs = *(char **)(in_RDI + 0x80);
                    peVar9 = std::
                             __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x4f02f9);
                    std::__cxx11::string::string(local_118,(string *)&peVar9->file_path);
                    std::operator+(__lhs,__rhs);
                    std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
                    std::operator+((any *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
                    paVar11 = &local_199;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_198,"Unavailable encoding.",paVar11);
                    exception::exception
                              (this_00,CONCAT17(uVar2,in_stack_fffffffffffffc78),
                               in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68,
                               (string *)
                               CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar6,CONCAT14(uVar5,uVar12)))
                                       ));
                    __cxa_throw(__rhs,&exception::typeinfo,exception::~exception);
                  }
                  *(undefined4 *)(in_RDI + 0x78) = 2;
                }
              }
            }
            else {
              uVar6 = std::operator==(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
              if (!(bool)uVar6) {
                uVar8 = __cxa_allocate_exception(0x90);
                peVar9 = std::
                         __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x4f0857);
                std::__cxx11::string::string(local_2d0,(string *)&peVar9->file_path);
                std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
                uVar10 = std::__cxx11::string::empty();
                local_332 = 0;
                if ((uVar10 & 1) == 0) {
                  std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
                }
                else {
                  paVar11 = &local_331;
                  std::allocator<char>::allocator();
                  local_332 = 1;
                  std::__cxx11::string::string(local_330,"",paVar11);
                }
                std::operator+(in_stack_fffffffffffffc48,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar6,in_stack_fffffffffffffc40));
                paVar11 = &local_359;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_358,"Wrong grammar for preprocessor command.",paVar11);
                exception::exception
                          (this_00,CONCAT17(uVar2,in_stack_fffffffffffffc78),
                           in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68,
                           (string *)
                           CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffc65,
                                                                  CONCAT14(in_stack_fffffffffffffc64
                                                                           ,
                                                  in_stack_fffffffffffffc60)))));
                __cxa_throw(uVar8,&exception::typeinfo,exception::~exception);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&stack0xfffffffffffffe40,"210508",
                         (allocator *)&stack0xfffffffffffffe3f);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe3f);
              bVar1 = std::operator>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
              if (bVar1) {
                local_2a9 = 1;
                uVar8 = __cxa_allocate_exception(0x90);
                peVar9 = std::
                         __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x4f0593);
                std::__cxx11::string::string(local_1e8,(string *)&peVar9->file_path);
                std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
                std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
                std::operator+((any *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
                std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
                std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
                std::operator+((any *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
                exception::exception
                          (this_00,CONCAT17(uVar2,in_stack_fffffffffffffc78),
                           in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68,
                           (string *)
                           CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffc65,
                                                                  CONCAT14(in_stack_fffffffffffffc64
                                                                           ,
                                                  in_stack_fffffffffffffc60)))));
                local_2a9 = 0;
                __cxa_throw(uVar8,&exception::typeinfo,exception::~exception);
              }
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
            }
          }
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4f0ab2);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffc10);
          std::__cxx11::string::~string(local_b0);
        }
      }
      std::__cxx11::string::~string((string *)local_58);
    }
    else if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x4f0b67);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      run(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    else {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x4f0b29);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffc10);
      std::__cxx11::string::append((string *)(in_RDI + 0x90));
    }
  }
  return;
}

Assistant:

void repl::exec(const string &code)
	{
		// Preprocess
		++line_num;
		int mode = 0;
		for (auto &ch: code) {
			if (mode == 0) {
				if (!std::isspace(ch)) {
					switch (ch) {
					case '#':
						context->file_buff.emplace_back();
						return;
					case '@':
						mode = 1;
						break;
					default:
						mode = -1;
					}
				}
			}
			else if (mode == 1) {
				if (!std::isspace(ch))
					cmd_buff.push_back(ch);
			}
			else
				break;
		}
		switch (mode) {
		default:
			break;
		case 0:
			return;
		case 1: {
			std::string cmd;
			std::swap(cmd_buff, cmd);
			if (cmd == "begin" && !multi_line) {
				multi_line = true;
				context->file_buff.emplace_back();
			}
			else if (cmd == "end" && multi_line) {
				multi_line = false;
				std::string line;
				std::swap(line_buff, line);
				this->run(line);
			}
			else {
				auto pos = cmd.find(':');
				std::string arg;
				if (pos != std::string::npos) {
					arg = cmd.substr(pos + 1);
					cmd = cmd.substr(0, pos);
				}
				if (cmd == "exit") {
					int code = 0;
					current_process->on_process_exit.touch(&code);
				}
				else if (cmd == "charset") {
					if (arg == "ascii")
						encoding = charset::ascii;
					else if (arg == "utf8")
						encoding = charset::utf8;
					else if (arg == "gbk")
						encoding = charset::gbk;
					else
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Unavailable encoding.");
				}
				else if (cmd == "require") {
					std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
					if (arg > version_str)
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Newer Language Standard required: " + arg + ", now on " + version_str);
				}
				else
					throw exception(line_num, context->file_path, "@" + cmd + (arg.empty() ? "" : ": " + arg),
					                "Wrong grammar for preprocessor command.");
				context->file_buff.emplace_back();
			}
			return;
		}
		}
		if (multi_line) {
			context->file_buff.emplace_back();
			line_buff.append(code);
		}
		else {
			context->file_buff.emplace_back(code);
			this->run(code);
		}
	}